

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::MetalMaterial__sample
                 (ISPCMetalMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,DifferentialGeometry *dg,
                 Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  long in_RSI;
  Vec3fa *in_RDI;
  undefined8 *in_R8;
  long in_R9;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  Vec3fa VVar9;
  Sample3f *in_stack_00000008;
  undefined4 *in_stack_00000018;
  PowerCosineDistribution distribution;
  __m128 r;
  __m128 a;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a_1;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_2;
  undefined8 in_stack_fffffffffffff820;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  Sample3f local_7b8;
  undefined4 local_790;
  undefined4 local_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  Sample3f local_778;
  float local_74c;
  long local_748;
  undefined8 *local_740;
  undefined4 *local_718;
  undefined4 *local_710;
  undefined1 local_708 [16];
  ulong local_6f8;
  Vec3fa *wi;
  DifferentialGeometry *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  float fVar10;
  Vec3fa *in_stack_fffffffffffff928;
  Vec3fa *in_stack_fffffffffffff930;
  PowerCosineDistribution *in_stack_fffffffffffff938;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined4 local_694;
  undefined8 *local_690;
  undefined4 local_674;
  undefined8 *local_670;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined1 *local_630;
  undefined1 local_628 [16];
  undefined4 local_60c;
  undefined1 local_608 [28];
  float local_5ec;
  ulong local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  ulong local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  ulong local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  BRDF *local_4b8;
  ISPCMetalMaterial *pIStack_4b0;
  undefined1 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  ISPCMetalMaterial *pIStack_480;
  BRDF **local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_458;
  BRDF **local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  BRDF **local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  BRDF **local_3d8;
  undefined8 *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  BRDF **local_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  BRDF *local_2b8;
  ISPCMetalMaterial *pIStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  BRDF **local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  BRDF **local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  BRDF **local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  BRDF *local_1a8;
  ISPCMetalMaterial *pIStack_1a0;
  BRDF **local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  BRDF *local_138;
  ISPCMetalMaterial *pIStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_cc;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  fVar10 = *(float *)(in_RSI + 0x40);
  local_608._4_4_ = 0;
  local_608._0_4_ = fVar10;
  local_608._8_8_ = (Vec3fa *)0x0;
  local_6f8 = local_608._0_8_;
  local_5e8 = local_608._0_8_;
  uStack_5e0 = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_608._0_8_;
  local_708 = rcpss(auVar4,auVar4);
  local_60c = 0x40000000;
  local_628 = ZEXT416(0x40000000);
  local_5a8 = local_608._0_8_;
  uStack_5a0 = 0;
  local_598._0_4_ = local_708._0_4_;
  fVar6 = (float)local_598;
  local_598._4_4_ = local_708._4_4_;
  local_598._0_4_ = (float)local_598 * fVar10;
  uStack_590 = local_708._8_8_;
  local_588 = local_598;
  uStack_580 = local_708._8_8_;
  fVar5 = 2.0 - (float)local_598;
  local_578 = (ulong)(uint)fVar5;
  uStack_570 = 0;
  local_5c8 = local_578;
  uStack_5c0 = 0;
  fVar6 = fVar6 * fVar5;
  local_5b8 = CONCAT44(local_598._4_4_,fVar6);
  uStack_5b0 = local_708._8_8_;
  local_5d8 = local_5b8;
  uStack_5d0 = local_708._8_8_;
  local_748 = in_R9;
  local_740 = in_R8;
  wi = (Vec3fa *)local_608._8_8_;
  local_608._0_16_ = ZEXT416((uint)fVar10);
  local_5ec = fVar10;
  local_74c = (float)make_PowerCosineDistribution(fVar6);
  local_6a8 = (undefined8 *)(local_748 + 0x40);
  local_6a0 = local_740;
  local_648 = &local_6b8;
  local_650 = local_740;
  uVar7 = *local_740;
  uVar1 = local_740[1];
  uVar2 = *local_6a8;
  uVar3 = *(undefined8 *)(local_748 + 0x48);
  local_18._0_4_ = (float)uVar7;
  local_18._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_10._0_4_ = (float)uVar1;
  uStack_10._4_4_ = (float)((ulong)uVar1 >> 0x20);
  local_28._0_4_ = (float)uVar2;
  local_28._4_4_ = (float)((ulong)uVar2 >> 0x20);
  uStack_20._0_4_ = (float)uVar3;
  uStack_20._4_4_ = (float)((ulong)uVar3 >> 0x20);
  local_68 = (float)local_18 * (float)local_28;
  local_2c8 = local_18._4_4_ * local_28._4_4_;
  local_218 = (float)uStack_10 * (float)uStack_20;
  fStack_5c = uStack_10._4_4_ * uStack_20._4_4_;
  local_468 = CONCAT44(local_2c8,local_68);
  uStack_460 = CONCAT44(fStack_5c,local_218);
  local_458 = &local_528;
  local_438 = &local_538;
  local_328 = CONCAT44(local_2c8,local_2c8);
  uStack_320 = CONCAT44(local_2c8,local_2c8);
  local_418 = &local_548;
  local_238 = CONCAT44(local_218,local_218);
  uStack_230 = CONCAT44(local_218,local_218);
  local_3a8 = &local_568;
  local_368 = local_68 + local_2c8;
  fStack_364 = local_2c8 + local_2c8;
  fStack_360 = local_218 + local_2c8;
  fStack_35c = fStack_5c + local_2c8;
  local_158 = CONCAT44(fStack_364,local_368);
  uStack_150 = CONCAT44(fStack_35c,fStack_360);
  local_3a0 = &local_558;
  fVar6 = local_368 + local_218;
  fStack_394 = fStack_364 + local_218;
  fStack_390 = fStack_360 + local_218;
  fStack_38c = fStack_35c + local_218;
  local_508 = CONCAT44(fStack_394,fVar6);
  uStack_500 = CONCAT44(fStack_38c,fStack_390);
  uVar8 = 0;
  local_658 = local_6a8;
  local_510 = local_648;
  local_440 = local_458;
  local_420 = local_458;
  local_3b0 = local_418;
  local_398 = fVar6;
  local_388 = local_3a0;
  local_380 = local_438;
  local_378 = local_458;
  local_370 = local_3a8;
  local_350 = local_3a8;
  local_340 = local_3a0;
  local_338 = local_458;
  local_330 = local_438;
  local_310 = local_438;
  fStack_2c4 = local_2c8;
  fStack_2c0 = local_2c8;
  fStack_2bc = local_2c8;
  local_2a8 = local_468;
  uStack_2a0 = uStack_460;
  local_290 = local_458;
  local_288 = local_438;
  local_280 = local_458;
  local_278 = local_418;
  local_270 = local_3a8;
  local_248 = local_458;
  local_240 = local_418;
  local_220 = local_418;
  fStack_214 = local_218;
  fStack_210 = local_218;
  fStack_20c = local_218;
  local_208 = local_468;
  uStack_200 = uStack_460;
  local_1f0 = local_458;
  local_188 = local_328;
  uStack_180 = uStack_320;
  local_178 = local_468;
  uStack_170 = uStack_460;
  local_168 = local_238;
  uStack_160 = uStack_230;
  fStack_64 = local_2c8;
  fStack_60 = local_218;
  local_50 = local_648;
  local_28 = uVar2;
  uStack_20 = uVar3;
  local_18 = uVar7;
  uStack_10 = uVar1;
  local_6b8 = local_468;
  uStack_6b0 = uStack_460;
  local_568 = local_158;
  uStack_560 = uStack_150;
  local_558 = local_508;
  uStack_550 = uStack_500;
  local_548 = local_238;
  uStack_540 = uStack_230;
  local_538 = local_328;
  uStack_530 = uStack_320;
  local_528 = local_468;
  uStack_520 = uStack_460;
  if (0.0 < fVar6) {
    local_710 = &local_790;
    local_718 = in_stack_00000018;
    local_790 = *in_stack_00000018;
    local_78c = in_stack_00000018[1];
    sample(in_stack_fffffffffffff938,in_stack_fffffffffffff930,in_stack_fffffffffffff928,
           (Sample3f *)CONCAT44(fVar10,in_stack_fffffffffffff920),(Vec2f *)in_stack_fffffffffffff918
          );
    local_640 = (undefined8 *)(local_748 + 0x40);
    local_630 = &stack0xfffffffffffff928;
    uVar7 = *(undefined8 *)&(in_stack_00000008->v).field_0;
    uVar1 = *(undefined8 *)((long)&(in_stack_00000008->v).field_0 + 8);
    uVar2 = *local_640;
    uVar3 = *(undefined8 *)(local_748 + 0x48);
    local_38._0_4_ = (float)uVar7;
    local_38._4_4_ = (float)((ulong)uVar7 >> 0x20);
    uStack_30._0_4_ = (float)uVar1;
    uStack_30._4_4_ = (float)((ulong)uVar1 >> 0x20);
    local_48._0_4_ = (float)uVar2;
    local_48._4_4_ = (float)((ulong)uVar2 >> 0x20);
    uStack_40._0_4_ = (float)uVar3;
    uStack_40._4_4_ = (float)((ulong)uVar3 >> 0x20);
    local_88 = (float)local_38 * (float)local_48;
    local_2d8 = local_38._4_4_ * local_48._4_4_;
    local_1b8 = (float)uStack_30 * (float)uStack_40;
    fStack_7c = uStack_30._4_4_ * uStack_40._4_4_;
    local_2b8 = (BRDF *)CONCAT44(local_2d8,local_88);
    pIStack_480 = (ISPCMetalMaterial *)CONCAT44(fStack_7c,local_1b8);
    local_470 = &local_4b8;
    local_448 = &local_4c8;
    local_2f8 = CONCAT44(local_2d8,local_2d8);
    uStack_2f0 = CONCAT44(local_2d8,local_2d8);
    local_428 = &local_4d8;
    local_1d8 = CONCAT44(local_1b8,local_1b8);
    uStack_1d0 = CONCAT44(local_1b8,local_1b8);
    local_408 = &local_4f8;
    local_3c8 = local_88 + local_2d8;
    fStack_3c4 = local_2d8 + local_2d8;
    fStack_3c0 = local_1b8 + local_2d8;
    fStack_3bc = fStack_7c + local_2d8;
    local_118 = CONCAT44(fStack_3c4,local_3c8);
    uStack_110 = CONCAT44(fStack_3bc,fStack_3c0);
    local_400 = &local_4e8;
    fVar6 = local_3c8 + local_1b8;
    fStack_3f4 = fStack_3c4 + local_1b8;
    fStack_3f0 = fStack_3c0 + local_1b8;
    fStack_3ec = fStack_3bc + local_1b8;
    local_498 = CONCAT44(fStack_3f4,fVar6);
    uStack_490 = CONCAT44(fStack_3ec,fStack_3f0);
    uVar8 = 0;
    local_4a0 = local_630;
    local_450 = local_470;
    local_430 = local_470;
    local_410 = local_428;
    local_3f8 = fVar6;
    local_3e8 = local_400;
    local_3e0 = local_448;
    local_3d8 = local_470;
    local_3d0 = local_408;
    local_3b8 = local_408;
    local_348 = local_400;
    local_308 = local_470;
    local_300 = local_448;
    local_2e0 = local_448;
    fStack_2d4 = local_2d8;
    fStack_2d0 = local_2d8;
    fStack_2cc = local_2d8;
    pIStack_2b0 = pIStack_480;
    local_298 = local_470;
    local_268 = local_448;
    local_260 = local_470;
    local_258 = local_428;
    local_250 = local_408;
    local_1e8 = local_470;
    local_1e0 = local_428;
    local_1c0 = local_428;
    fStack_1b4 = local_1b8;
    fStack_1b0 = local_1b8;
    fStack_1ac = local_1b8;
    local_1a8 = local_2b8;
    pIStack_1a0 = pIStack_480;
    local_190 = local_470;
    local_148 = local_2f8;
    uStack_140 = uStack_2f0;
    local_138 = local_2b8;
    pIStack_130 = pIStack_480;
    local_128 = local_1d8;
    uStack_120 = uStack_1d0;
    fStack_84 = local_2d8;
    fStack_80 = local_1b8;
    local_70 = local_630;
    local_48 = uVar2;
    uStack_40 = uVar3;
    local_38 = uVar7;
    uStack_30 = uVar1;
    local_4f8 = local_118;
    uStack_4f0 = uStack_110;
    local_4e8 = local_498;
    uStack_4e0 = uStack_490;
    local_4d8 = local_1d8;
    uStack_4d0 = uStack_1d0;
    local_4c8 = local_2f8;
    uStack_4c0 = uStack_2f0;
    local_4b8 = local_2b8;
    pIStack_4b0 = pIStack_480;
    if (0.0 < fVar6) {
      VVar9 = MetalMaterial__eval(pIStack_480,local_2b8,
                                  (Vec3fa *)CONCAT44(fVar10,in_stack_fffffffffffff920),
                                  in_stack_fffffffffffff918,wi);
      fVar6 = VVar9.field_0._8_4_;
      uVar8 = VVar9.field_0._12_4_;
      uVar7 = VVar9.field_0._0_8_;
    }
    else {
      local_670 = &local_7c8;
      local_674 = 0;
      local_cc = 0;
      local_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      local_7c8 = 0;
      uStack_7c0 = 0;
      make_Sample3f(in_RDI,(float)((ulong)in_stack_fffffffffffff820 >> 0x20));
      Sample3f::operator=(in_stack_00000008,&local_7b8);
      uVar7 = 0;
      *(undefined8 *)&in_RDI->field_0 = 0;
      *(undefined8 *)((long)&in_RDI->field_0 + 8) = 0;
    }
  }
  else {
    local_690 = &local_788;
    local_694 = 0;
    local_8c = 0;
    local_a8 = 0;
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    local_788 = 0;
    uStack_780 = 0;
    make_Sample3f(in_RDI,(float)((ulong)&local_778 >> 0x20));
    Sample3f::operator=(in_stack_00000008,&local_778);
    uVar7 = 0;
    *(undefined8 *)&in_RDI->field_0 = 0;
    *(undefined8 *)((long)&in_RDI->field_0 + 8) = 0;
  }
  VVar9.field_0.m128[3] = (float)uVar8;
  VVar9.field_0.m128[2] = fVar6;
  VVar9.field_0._0_8_ = uVar7;
  return (Vec3fa)VVar9.field_0;
}

Assistant:

Vec3fa MetalMaterial__sample(ISPCMetalMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  const PowerCosineDistribution distribution = make_PowerCosineDistribution(rcp(This->roughness));

  if (dot(wo,dg.Ns) <= 0.0f) { wi_o = make_Sample3f(Vec3fa(0.0f),0.0f); return Vec3fa(0.f); }
  sample(distribution,wo,dg.Ns,wi_o,s);
  if (dot(wi_o.v,dg.Ns) <= 0.0f) { wi_o = make_Sample3f(Vec3fa(0.0f),0.0f); return Vec3fa(0.f); }
  return MetalMaterial__eval(This,brdf,wo,dg,wi_o.v);
}